

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  long lVar10;
  timeval tVar11;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdwrite;
  fd_set fdread;
  fd_set fdexcep;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar10 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                  ,0x36);
    iVar1 = 0x7c;
    goto LAB_001023e4;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2a,1);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x40,0);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x51,0);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          lVar10 = curl_multi_init();
          if (lVar10 == 0) {
            lVar10 = 0;
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                          ,0x3f);
            iVar1 = 0x7b;
            goto LAB_001023e4;
          }
          iVar1 = curl_multi_add_handle(lVar10,lVar3);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_multi_perform(lVar10,&local_1d0);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              if (local_1d0 < 0) {
                pcVar9 = 
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ;
                uVar8 = 0x45;
LAB_001026d7:
                curl_mfprintf(_stderr,pcVar9,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                              ,uVar8);
                iVar1 = 0x7a;
              }
              else {
                tVar11 = tutil_tvnow();
                lVar5 = tutil_tvdiff(tVar11,tv_test_start);
                if (lVar5 < 0xea61) {
                  iVar1 = 0;
                  if (local_1d0 != 0) {
                    do {
                      local_1cc = -99;
                      local_138.__fds_bits[0] = 0;
                      local_138.__fds_bits[1] = 0;
                      local_138.__fds_bits[2] = 0;
                      local_138.__fds_bits[3] = 0;
                      local_138.__fds_bits[4] = 0;
                      local_138.__fds_bits[5] = 0;
                      local_138.__fds_bits[6] = 0;
                      local_138.__fds_bits[7] = 0;
                      local_138.__fds_bits[8] = 0;
                      local_138.__fds_bits[9] = 0;
                      local_138.__fds_bits[10] = 0;
                      local_138.__fds_bits[0xb] = 0;
                      local_138.__fds_bits[0xc] = 0;
                      local_138.__fds_bits[0xd] = 0;
                      local_138.__fds_bits[0xe] = 0;
                      local_138.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0] = 0;
                      local_1b8.__fds_bits[1] = 0;
                      local_1b8.__fds_bits[2] = 0;
                      local_1b8.__fds_bits[3] = 0;
                      local_1b8.__fds_bits[4] = 0;
                      local_1b8.__fds_bits[5] = 0;
                      local_1b8.__fds_bits[6] = 0;
                      local_1b8.__fds_bits[7] = 0;
                      local_1b8.__fds_bits[8] = 0;
                      local_1b8.__fds_bits[9] = 0;
                      local_1b8.__fds_bits[10] = 0;
                      local_1b8.__fds_bits[0xb] = 0;
                      local_1b8.__fds_bits[0xc] = 0;
                      local_1b8.__fds_bits[0xd] = 0;
                      local_1b8.__fds_bits[0xe] = 0;
                      local_1b8.__fds_bits[0xf] = 0;
                      local_b8.__fds_bits[0xe] = 0;
                      local_b8.__fds_bits[0xf] = 0;
                      local_b8.__fds_bits[0xc] = 0;
                      local_b8.__fds_bits[0xd] = 0;
                      local_b8.__fds_bits[10] = 0;
                      local_b8.__fds_bits[0xb] = 0;
                      local_b8.__fds_bits[8] = 0;
                      local_b8.__fds_bits[9] = 0;
                      local_b8.__fds_bits[6] = 0;
                      local_b8.__fds_bits[7] = 0;
                      local_b8.__fds_bits[4] = 0;
                      local_b8.__fds_bits[5] = 0;
                      local_b8.__fds_bits[2] = 0;
                      local_b8.__fds_bits[3] = 0;
                      local_b8.__fds_bits[0] = 0;
                      local_b8.__fds_bits[1] = 0;
                      local_1c8.tv_sec = 1;
                      local_1c8.tv_usec = 0;
                      iVar2 = curl_multi_fdset(lVar10,&local_138,&local_1b8,&local_b8,&local_1cc);
                      uVar8 = _stderr;
                      if (iVar2 != 0) {
                        uVar4 = curl_multi_strerror(iVar2);
                        pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                        uVar7 = 0x5a;
                        iVar1 = iVar2;
LAB_001027fa:
                        curl_mfprintf(uVar8,pcVar9,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                      ,uVar7,iVar1,uVar4);
                        break;
                      }
                      if (local_1cc < -1) {
                        pcVar9 = 
                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                        ;
                        uVar8 = 0x5a;
                        goto LAB_001026d7;
                      }
                      iVar2 = select_wrapper(local_1cc + 1,&local_138,&local_1b8,&local_b8,
                                             &local_1c8);
                      if (iVar2 == -1) {
                        piVar6 = __errno_location();
                        uVar8 = _stderr;
                        iVar1 = *piVar6;
                        pcVar9 = strerror(iVar1);
                        curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                      ,0x5e,iVar1,pcVar9);
                        iVar1 = 0x79;
                        break;
                      }
                      tVar11 = tutil_tvnow();
                      lVar5 = tutil_tvdiff(tVar11,tv_test_start);
                      if (60000 < lVar5) {
                        uVar8 = 0x60;
                        goto LAB_00102705;
                      }
                      iVar2 = curl_multi_perform(lVar10,&local_1d0);
                      uVar8 = _stderr;
                      if (iVar2 != 0) {
                        uVar4 = curl_multi_strerror(iVar2);
                        pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uVar7 = 99;
                        iVar1 = iVar2;
                        goto LAB_001027fa;
                      }
                      if (local_1d0 < 0) {
                        pcVar9 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uVar8 = 99;
                        goto LAB_001026d7;
                      }
                      tVar11 = tutil_tvnow();
                      lVar5 = tutil_tvdiff(tVar11,tv_test_start);
                      if (60000 < lVar5) {
                        uVar8 = 0x65;
                        goto LAB_00102705;
                      }
                    } while (local_1d0 != 0);
                  }
                }
                else {
                  uVar8 = 0x47;
LAB_00102705:
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                ,uVar8);
                  iVar1 = 0x7d;
                }
              }
              goto LAB_001023e4;
            }
            uVar4 = curl_multi_strerror(iVar1);
            pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uVar7 = 0x45;
          }
          else {
            uVar4 = curl_multi_strerror(iVar1);
            pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uVar7 = 0x42;
          }
        }
        else {
          uVar4 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar10 = 0;
          uVar7 = 0x3c;
        }
      }
      else {
        uVar4 = curl_easy_strerror(iVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar10 = 0;
        uVar7 = 0x3b;
      }
    }
    else {
      uVar4 = curl_easy_strerror(iVar1);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar10 = 0;
      uVar7 = 0x3a;
    }
  }
  else {
    uVar4 = curl_easy_strerror(iVar1);
    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar10 = 0;
    uVar7 = 0x39;
  }
  curl_mfprintf(uVar8,pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                ,uVar7,iVar1,uVar4);
LAB_001023e4:
  curl_multi_cleanup(lVar10);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}